

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnOut.cpp
# Opt level: O1

void __thiscall NaPetriCnOutput::describe(NaPetriCnOutput *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  NaPetriNode *pNVar7;
  undefined4 extraout_var;
  char *pcVar8;
  
  pcVar8 = "";
  if (this->bStarter != false) {
    pcVar8 = " << STARTER >>";
  }
  pcVar6 = NaPetriConnector::name(&this->super_NaPetriConnector);
  NaPrintLog("output%s connector \'%s\': ",pcVar8,pcVar6);
  pNVar7 = NaPetriConnector::host(&this->super_NaPetriConnector);
  if (pNVar7 != (NaPetriNode *)0x0) {
    uVar3 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[2])(this);
    uVar1 = this->nPrCnt;
    uVar2 = this->idData;
    iVar4 = (*(this->super_NaPetriConnector)._vptr_NaPetriConnector[8])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x30))
                      ((long *)CONCAT44(extraout_var,iVar4));
    NaPrintLog("links=%u  pr.cnt=%u  data_id=%d  data_dim=%u\n",(ulong)uVar3,(ulong)uVar1,
               (ulong)uVar2,(ulong)uVar5);
    return;
  }
  NaPrintLog("no host node\n");
  return;
}

Assistant:

void
NaPetriCnOutput::describe ()
{
    NaPrintLog("output%s connector '%s': ",
	       bStarter?" << STARTER >>": "", name());
    if(NULL == host()){
        NaPrintLog("no host node\n");
    //}else if(0 == links()){
    //    NaPrintLog("no links\n");
    }else{
        NaPrintLog("links=%u  pr.cnt=%u  data_id=%d  data_dim=%u\n",
                   links(), nPrCnt, idData, data().dim());
    }
}